

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

bool IsGoodConstantArray(ExpressionContext *ctx,VmModule *module,VmInstruction *instInit)

{
  VmValueType VVar1;
  bool bVar2;
  VmValue **ppVVar3;
  ulong uVar4;
  long lVar5;
  VmInstruction *instInit_00;
  
  if (instInit->cmd != VM_INST_ARRAY) {
    __assert_fail("instInit->cmd == VM_INST_ARRAY",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xc34,
                  "bool IsGoodConstantArray(ExpressionContext &, VmModule *, VmInstruction *)");
  }
  if ((instInit->arguments).count != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      instInit_00 = *(VmInstruction **)((long)(instInit->arguments).data + lVar5);
      if (instInit_00 == (VmInstruction *)0x0) {
        return false;
      }
      if ((instInit_00->super_VmValue).typeID == 2) {
        if (instInit_00->cmd != VM_INST_ARRAY) {
          if (instInit_00->cmd == VM_INST_DOUBLE_TO_FLOAT) {
            if ((instInit_00->arguments).count == 0) {
LAB_00275482:
              __assert_fail("index < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x199,
                            "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                           );
            }
            ppVVar3 = (instInit_00->arguments).data;
          }
          else {
            RunConstantPropagation(ctx,module,&instInit_00->super_VmValue,true);
            if ((instInit->arguments).count <= uVar4) goto LAB_00275482;
            ppVVar3 = (VmValue **)((long)(instInit->arguments).data + lVar5);
          }
          instInit_00 = (VmInstruction *)*ppVVar3;
          if (instInit_00 == (VmInstruction *)0x0) {
            return false;
          }
          goto LAB_0027542a;
        }
        bVar2 = IsGoodConstantArray(ctx,module,instInit_00);
        if (!bVar2) goto LAB_0027542a;
      }
      else {
LAB_0027542a:
        if ((((instInit_00->super_VmValue).typeID != 1) ||
            (*(char *)((long)&(instInit_00->arguments).allocator + 1) != '\0')) ||
           ((VVar1 = (instInit_00->super_VmValue).type.type, 2 < VVar1 - VM_TYPE_INT &&
            ((VVar1 != VM_TYPE_STRUCT || ((instInit_00->arguments).little[0] == (VmValue *)0x0))))))
        {
          return false;
        }
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar4 < (instInit->arguments).count);
  }
  return true;
}

Assistant:

bool IsGoodConstantArray(ExpressionContext &ctx, VmModule *module, VmInstruction *instInit)
{
	assert(instInit->cmd == VM_INST_ARRAY);

	for(unsigned i = 0; i < instInit->arguments.size(); i++)
	{
		VmValue *elementValue = instInit->arguments[i];

		if(VmInstruction *elementInst = getType<VmInstruction>(elementValue))
		{
			if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
			{
				elementValue = elementInst->arguments[0];
			}
			else if(elementInst->cmd == VM_INST_ARRAY)
			{
				if(IsGoodConstantArray(ctx, module, elementInst))
					continue;
			}
			else
			{
				RunConstantPropagation(ctx, module, elementInst, true);
				elementValue = instInit->arguments[i];
			}
		}

		VmConstant *element = getType<VmConstant>(elementValue);

		if(!element || element->isReference)
			return false;

		if(element->type.type == VM_TYPE_INT)
			continue;
		else if(element->type.type == VM_TYPE_DOUBLE)
			continue;
		else if(element->type.type == VM_TYPE_LONG)
			continue;
		else if(element->type.type == VM_TYPE_STRUCT && element->sValue)
			continue;

		return false;
	}

	return true;
}